

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O3

void __thiscall
soul::ArrayWithPreallocation<soul::AST::StructDeclaration::Member,_16UL>::clear
          (ArrayWithPreallocation<soul::AST::StructDeclaration::Member,_16UL> *this)

{
  long lVar1;
  ulong uVar2;
  
  if (this->numActive != 0) {
    lVar1 = 0x10;
    uVar2 = 0;
    do {
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull
                (*(SourceCodeText **)((long)&(this->items->type).object + lVar1));
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x28;
    } while (uVar2 < this->numActive);
  }
  this->numActive = 0;
  if (0x10 < this->numAllocated) {
    if (this->items != (Member *)0x0) {
      operator_delete__(this->items);
    }
    this->items = (Member *)this->space;
    this->numAllocated = 0x10;
  }
  return;
}

Assistant:

void clear() noexcept
    {
        for (size_t i = 0; i < numActive; ++i)
            items[i].~Item();

        numActive = 0;
        freeIfHeapAllocated();
    }